

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O2

void av1_collect_motion_search_features_sb
               (AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,int mi_row,int mi_col,
               BLOCK_SIZE bsize,aom_partition_features_t *features)

{
  int iVar1;
  BLOCK_SIZE BVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  undefined1 *memblk;
  ulong uVar7;
  void *memblk_00;
  void *memblk_01;
  FILE *__stream;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  size_t num;
  int iVar11;
  SIMPLE_MOTION_DATA_TREE *sms_root;
  uint uVar12;
  undefined1 *puVar13;
  ulong uVar14;
  undefined1 *puVar15;
  uint uVar16;
  int j;
  long lVar17;
  int iVar18;
  int i;
  void *pvVar19;
  int row;
  SIMPLE_MOTION_DATA_TREE *tree;
  void *pvVar20;
  bool bVar21;
  uint *in_stack_fffffffffffffe78;
  int ref_list [1];
  char local_138 [264];
  
  if (((cpi->common).current_frame.frame_type & 0xfd) != 0) {
    if ((cpi->oxcf).pass == AOM_RC_FIRST_PASS) {
      bVar21 = false;
    }
    else {
      bVar21 = cpi->compressor_stage != '\x01';
    }
    uVar10 = 1;
    uVar7 = (ulong)(((cpi->common).seq_params)->sb_size == BLOCK_128X128) << 10 | 0x155;
    if (!bVar21) {
      uVar7 = uVar10;
    }
    memblk = (undefined1 *)aom_calloc(uVar7,0x78);
    if (memblk == (undefined1 *)0x0) {
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,"Failed to allocate sms_tree");
    }
    if ((cpi->oxcf).pass == AOM_RC_FIRST_PASS) {
      bVar21 = false;
    }
    else {
      bVar21 = cpi->compressor_stage != '\x01';
    }
    BVar2 = ((cpi->common).seq_params)->sb_size;
    if (bVar21) {
      uVar10 = (ulong)(BVar2 == BLOCK_128X128) << 10 | 0x155;
      uVar7 = 0x100;
      if (BVar2 == BLOCK_128X128) {
        uVar7 = 0x400;
      }
      for (lVar9 = 0; uVar7 * 0x78 - lVar9 != 0; lVar9 = lVar9 + 0x78) {
        memblk[lVar9] = 0;
      }
      lVar9 = 1;
      puVar13 = memblk;
      uVar14 = uVar7;
      while (3 < (uint)uVar7) {
        uVar5 = (uint)uVar7 >> 2;
        uVar7 = (ulong)uVar5;
        uVar14 = uVar14 & 0xffffffff;
        puVar15 = memblk + uVar14 * 0x78 + 8;
        for (uVar16 = 0; uVar16 != uVar5; uVar16 = uVar16 + 1) {
          memblk[uVar14 * 0x78] = square[lVar9];
          for (lVar17 = 0; lVar17 != 4; lVar17 = lVar17 + 1) {
            *(undefined1 **)(puVar15 + lVar17 * 8) = puVar13;
            puVar13 = puVar13 + 0x78;
          }
          uVar14 = uVar14 + 1;
          puVar15 = puVar15 + 0x78;
        }
        lVar9 = lVar9 + 1;
      }
    }
    else {
      *memblk = 6;
    }
    sms_root = (SIMPLE_MOTION_DATA_TREE *)(memblk + uVar10 * 0x78 + -0x78);
    uVar10 = (ulong)bsize;
    uVar5 = mi_col;
    uVar16 = mi_row;
    av1_set_offsets_without_segment_id(cpi,&tile_data->tile_info,&td->mb,mi_row,mi_col,bsize);
    av1_init_simple_motion_search_mvs_for_sb(cpi,(TileInfo *)0x0,&td->mb,sms_root,mi_row,mi_col);
    av1_reset_simple_motion_tree_partition(sms_root,bsize);
    ref_list[0] = 7;
    if ((cpi->rc).is_src_frame_alt_ref == 0) {
      ref_list[0] = 1;
    }
    bVar3 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar10];
    uVar12 = (cpi->common).mi_params.mi_cols - mi_col;
    if ((int)(uint)bVar3 <= (int)uVar12) {
      uVar12 = (uint)bVar3;
    }
    bVar4 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar10];
    uVar8 = (cpi->common).mi_params.mi_rows - mi_row;
    if ((int)(uint)bVar4 <= (int)uVar8) {
      uVar8 = (uint)bVar4;
    }
    num = (size_t)(int)(((uint)(0 < (int)(uVar8 & 0x80000003)) + (int)uVar8 / 4) *
                       ((uint)(0 < (int)(uVar12 & 0x80000003)) + (int)uVar12 / 4));
    memblk_00 = aom_calloc(num,4);
    memblk_01 = aom_calloc(num,4);
    if (memblk_00 == (void *)0x0 || memblk_01 == (void *)0x0) {
      aom_free(memblk);
      aom_free(memblk_00);
      aom_free(memblk_01);
      aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                         "Error allocating block_sse & block_var");
    }
    iVar1 = bVar4 + uVar16;
    iVar11 = bVar3 + uVar5;
    uVar7 = 0;
    uVar12 = uVar16;
    while( true ) {
      iVar6 = (cpi->common).mi_params.mi_rows;
      if (iVar1 < iVar6) {
        iVar6 = iVar1;
      }
      iVar18 = (int)uVar7;
      if (iVar6 <= (int)uVar16) break;
      pvVar20 = (void *)((long)memblk_00 + (long)iVar18 * 4);
      pvVar19 = (void *)((long)memblk_01 + (long)iVar18 * 4);
      uVar8 = uVar5;
      while( true ) {
        iVar6 = (cpi->common).mi_params.mi_cols;
        if (iVar11 < iVar6) {
          iVar6 = iVar11;
        }
        if (iVar6 <= (int)uVar5) break;
        simple_motion_search_get_best_ref
                  (cpi,&td->mb,sms_root,uVar16,uVar5,BLOCK_16X16,ref_list,1,(int)pvVar20,
                   (int)pvVar19,in_stack_fffffffffffffe78,(uint *)CONCAT44(uVar12,uVar8));
        uVar5 = uVar5 + 4;
        uVar7 = (ulong)((int)uVar7 + 1);
        pvVar20 = (void *)((long)pvVar20 + 4);
        pvVar19 = (void *)((long)pvVar19 + 4);
      }
      uVar16 = uVar16 + 4;
      uVar5 = uVar8;
    }
    if (features == (aom_partition_features_t *)0x0) {
      snprintf(local_138,0x100,"%s/motion_search_feature_sb%d",(cpi->oxcf).partition_info_path,
               (ulong)(uint)cpi->sb_counter);
      __stream = fopen64(local_138,"w");
      fprintf(__stream,"%d,%d,%d,%d,%d\n",(ulong)uVar12,(ulong)uVar5,uVar10,0x10,uVar7);
      if (iVar18 < 1) {
        uVar7 = 0;
      }
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        fprintf(__stream,"%d",(ulong)*(uint *)((long)memblk_00 + uVar10 * 4));
        if ((long)uVar10 < (long)(iVar18 + -1)) {
          fputc(0x2c,__stream);
        }
      }
      fputc(10,__stream);
      for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        fprintf(__stream,"%d",(ulong)*(uint *)((long)memblk_01 + uVar10 * 4));
        if ((long)uVar10 < (long)(iVar18 + -1)) {
          fputc(0x2c,__stream);
        }
      }
      fputc(10,__stream);
      fclose(__stream);
    }
    else {
      (features->sb_features).motion_features.unit_length = 0x10;
      (features->sb_features).motion_features.num_units = iVar18;
      uVar10 = 0;
      if (iVar18 < 1) {
        uVar7 = 0;
      }
      for (; uVar7 != uVar10; uVar10 = uVar10 + 1) {
        (features->sb_features).motion_features.block_sse[uVar10] =
             *(int *)((long)memblk_00 + uVar10 * 4);
        (features->sb_features).motion_features.block_var[uVar10] =
             *(int *)((long)memblk_01 + uVar10 * 4);
      }
    }
    aom_free(memblk_00);
    aom_free(memblk_01);
    aom_free(memblk);
  }
  return;
}

Assistant:

void av1_collect_motion_search_features_sb(AV1_COMP *const cpi, ThreadData *td,
                                           TileDataEnc *tile_data,
                                           const int mi_row, const int mi_col,
                                           const BLOCK_SIZE bsize,
                                           aom_partition_features_t *features) {
  const AV1_COMMON *const cm = &cpi->common;
  if (frame_is_intra_only(cm)) return;

  MACROBLOCK *const x = &td->mb;
  const BLOCK_SIZE fixed_block_size = BLOCK_16X16;
  const int col_step = mi_size_wide[fixed_block_size];
  const int row_step = mi_size_high[fixed_block_size];
  SIMPLE_MOTION_DATA_TREE *sms_tree = NULL;
  const int stat_generation_stage = is_stat_generation_stage(cpi);
  const int is_sb_size_128 = cm->seq_params->sb_size == BLOCK_128X128;
  const int tree_nodes =
      av1_get_pc_tree_nodes(is_sb_size_128, stat_generation_stage);
  CHECK_MEM_ERROR(cm, sms_tree, aom_calloc(tree_nodes, sizeof(*sms_tree)));
  SIMPLE_MOTION_DATA_TREE *sms_root = setup_sms_tree(cpi, sms_tree);
  TileInfo *const tile_info = &tile_data->tile_info;
  av1_set_offsets_without_segment_id(cpi, tile_info, x, mi_row, mi_col, bsize);
  av1_init_simple_motion_search_mvs_for_sb(cpi, NULL, x, sms_root, mi_row,
                                           mi_col);
  av1_reset_simple_motion_tree_partition(sms_root, bsize);
  const int ref_list[] = { cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME
                                                        : LAST_FRAME };
  const int mi_width =
      AOMMIN(mi_size_wide[bsize], cm->mi_params.mi_cols - mi_col);
  const int mi_height =
      AOMMIN(mi_size_high[bsize], cm->mi_params.mi_rows - mi_row);
  const int col_steps = (mi_width / col_step) + ((mi_width % col_step) > 0);
  const int row_steps = (mi_height / row_step) + ((mi_height % row_step) > 0);
  const int num_blocks = col_steps * row_steps;
  unsigned int *block_sse = aom_calloc(num_blocks, sizeof(*block_sse));
  unsigned int *block_var = aom_calloc(num_blocks, sizeof(*block_var));
  if (!(block_sse && block_var)) {
    aom_free(sms_tree);
    aom_free(block_sse);
    aom_free(block_var);
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Error allocating block_sse & block_var");
  }
  int idx = 0;

  for (int row = mi_row;
       row < AOMMIN(mi_row + mi_size_high[bsize], cm->mi_params.mi_rows);
       row += row_step) {
    for (int col = mi_col;
         col < AOMMIN(mi_col + mi_size_wide[bsize], cm->mi_params.mi_cols);
         col += col_step) {
      simple_motion_search_get_best_ref(
          cpi, x, sms_root, row, col, fixed_block_size, ref_list,
          /*num_refs=*/1, /*use_subpixel=*/1,
          /*save_mv=*/1, &block_sse[idx], &block_var[idx]);
      ++idx;
    }
  }
  if (features == NULL) {
    write_motion_feature_to_file(cpi->oxcf.partition_info_path, cpi->sb_counter,
                                 block_sse, block_var, idx, bsize,
                                 fixed_block_size, mi_row, mi_col);
  } else {
    features->sb_features.motion_features.unit_length =
        block_size_wide[fixed_block_size];
    features->sb_features.motion_features.num_units = idx;
    for (int i = 0; i < idx; ++i) {
      features->sb_features.motion_features.block_sse[i] = block_sse[i];
      features->sb_features.motion_features.block_var[i] = block_var[i];
    }
  }

  aom_free(block_sse);
  aom_free(block_var);
  aom_free(sms_tree);
}